

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O3

Identifier * __thiscall
psy::TextElementTable<psy::C::Identifier>::find
          (TextElementTable<psy::C::Identifier> *this,char *chars,uint size)

{
  int iVar1;
  ulong uVar2;
  Identifier *pIVar3;
  
  if (this->buckets_ != (Identifier **)0x0) {
    uVar2 = psy::TextElement::hashCode(chars,size);
    pIVar3 = this->buckets_[(uVar2 & 0xffffffff) % (ulong)(uint)this->bucketCount_];
    if (pIVar3 != (Identifier *)0x0) {
      do {
        if ((*(uint *)&(pIVar3->super_Lexeme).field_0x8 == size) &&
           (iVar1 = strncmp(*(char **)&(pIVar3->super_Lexeme).field_0x10,chars,(ulong)size),
           iVar1 == 0)) {
          return pIVar3;
        }
        pIVar3 = *(Identifier **)&(pIVar3->super_Lexeme).field_0x20;
      } while (pIVar3 != (Identifier *)0x0);
    }
  }
  return (Identifier *)0x0;
}

Assistant:

const ElemT* find(const char* chars, unsigned int size) const
    {
        if (buckets_) {
            unsigned int h = ElemT::hashCode(chars, size);
            ElemT* elem = buckets_[h % bucketCount_];
            for (; elem; elem = static_cast<ElemT*>(elem->next_)) {
                if (elem->size() == size && !std::strncmp(elem->c_str(), chars, size))
                    return elem;
            }
        }
        return nullptr;
    }